

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool prvTidyXMLPreserveWhiteSpace(TidyDocImpl *doc,Node *element)

{
  int iVar1;
  Parser *pPVar2;
  AttVal *local_28;
  AttVal *attribute;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  for (local_28 = element->attributes; local_28 != (AttVal *)0x0; local_28 = local_28->next) {
    if (((local_28 != (AttVal *)0x0) && (local_28->dict != (Attribute *)0x0)) &&
       (local_28->dict->id == TidyAttr_XML_SPACE)) {
      if (((local_28 != (AttVal *)0x0) && (local_28->value != (tmbstr)0x0)) &&
         (iVar1 = prvTidytmbstrcasecmp(local_28->value,"preserve"), iVar1 == 0)) {
        return yes;
      }
      return no;
    }
  }
  if (element->element == (tmbstr)0x0) {
    doc_local._4_4_ = no;
  }
  else {
    if ((((((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
          (element->tag->id != TidyTag_PRE)) &&
         (((element == (Node *)0x0 || (element->tag == (Dict *)0x0)) ||
          (element->tag->id != TidyTag_SCRIPT)))) &&
        (((element == (Node *)0x0 || (element->tag == (Dict *)0x0)) ||
         (element->tag->id != TidyTag_STYLE)))) &&
       (pPVar2 = prvTidyFindParser(doc,element), pPVar2 != prvTidyParsePre)) {
      iVar1 = prvTidytmbstrcasecmp(element->element,"xsl:text");
      if (iVar1 == 0) {
        return yes;
      }
      return no;
    }
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(XMLPreserveWhiteSpace)( TidyDocImpl* doc, Node *element)
{
    AttVal *attribute;

    /* search attributes for xml:space */
    for (attribute = element->attributes; attribute; attribute = attribute->next)
    {
        if (attrIsXML_SPACE(attribute))
        {
            if (AttrValueIs(attribute, "preserve"))
                return yes;

            return no;
        }
    }

    if (element->element == NULL)
        return no;
        
    /* kludge for html docs without explicit xml:space attribute */
    if (nodeIsPRE(element)    ||
        nodeIsSCRIPT(element) ||
        nodeIsSTYLE(element)  ||
        TY_(FindParser)(doc, element) == TY_(ParsePre))
        return yes;

    /* kludge for XSL docs */
    if ( TY_(tmbstrcasecmp)(element->element, "xsl:text") == 0 )
        return yes;

    return no;
}